

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

upb_EncodeStatus
upb_Encoder_Encode(upb_encstate *encoder,upb_Message *msg,upb_MiniTable *l,char **buf,size_t *size,
                  _Bool prepend_len)

{
  void **ppvVar1;
  int iVar2;
  ulong in_RAX;
  size_t sVar3;
  char *pcVar4;
  size_t encoded_msg_size;
  ulong local_38;
  
  local_38 = in_RAX;
  iVar2 = __sigsetjmp(encoder->err,0);
  if (iVar2 == 0) {
    encode_message(encoder,msg,l,&local_38);
    if (prepend_len) {
      if ((local_38 < 0x80) && (pcVar4 = encoder->ptr, pcVar4 != encoder->buf)) {
        encoder->ptr = pcVar4 + -1;
        pcVar4[-1] = (char)local_38;
      }
      else {
        encode_longvarint(encoder,local_38);
      }
    }
    pcVar4 = encoder->ptr;
    sVar3 = (long)encoder->limit - (long)pcVar4;
    *size = sVar3;
    if (sVar3 == 0) {
      pcVar4 = &upb_Encoder_Encode::ch;
    }
    else if (pcVar4 == (char *)0x0) {
      __assert_fail("encoder->ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/wire/encode.c"
                    ,0x2b2,
                    "upb_EncodeStatus upb_Encoder_Encode(upb_encstate *const, const upb_Message *const, const upb_MiniTable *const, char **const, size_t *const, _Bool)"
                   );
    }
    *buf = pcVar4;
  }
  else {
    if (encoder->status == kUpb_EncodeStatus_Ok) {
      __assert_fail("encoder->status != kUpb_EncodeStatus_Ok",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/wire/encode.c"
                    ,0x2b6,
                    "upb_EncodeStatus upb_Encoder_Encode(upb_encstate *const, const upb_Message *const, const upb_MiniTable *const, char **const, size_t *const, _Bool)"
                   );
    }
    *buf = (char *)0x0;
    *size = 0;
  }
  ppvVar1 = (encoder->sorter).entries;
  if (ppvVar1 != (void **)0x0) {
    (*upb_alloc_global.func)(&upb_alloc_global,ppvVar1,0,0);
  }
  return encoder->status;
}

Assistant:

static upb_EncodeStatus upb_Encoder_Encode(upb_encstate* const encoder,
                                           const upb_Message* const msg,
                                           const upb_MiniTable* const l,
                                           char** const buf, size_t* const size,
                                           bool prepend_len) {
  // Unfortunately we must continue to perform hackery here because there are
  // code paths which blindly copy the returned pointer without bothering to
  // check for errors until much later (b/235839510). So we still set *buf to
  // NULL on error and we still set it to non-NULL on a successful empty result.
  if (UPB_SETJMP(encoder->err) == 0) {
    size_t encoded_msg_size;
    encode_message(encoder, msg, l, &encoded_msg_size);
    if (prepend_len) {
      encode_varint(encoder, encoded_msg_size);
    }
    *size = encoder->limit - encoder->ptr;
    if (*size == 0) {
      static char ch;
      *buf = &ch;
    } else {
      UPB_ASSERT(encoder->ptr);
      *buf = encoder->ptr;
    }
  } else {
    UPB_ASSERT(encoder->status != kUpb_EncodeStatus_Ok);
    *buf = NULL;
    *size = 0;
  }

  _upb_mapsorter_destroy(&encoder->sorter);
  return encoder->status;
}